

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O1

RK_S32 __thiscall mpp_list::fifo_rd(mpp_list *this,void *data,RK_S32 *size)

{
  int iVar1;
  mpp_list_node *__ptr;
  mpp_list_node *pmVar2;
  mpp_list_node *pmVar3;
  RK_S32 RVar4;
  
  RVar4 = -0x16;
  if ((this->head != (mpp_list_node *)0x0) && (RVar4 = -0x16, this->count != 0)) {
    __ptr = this->head->next;
    pmVar2 = __ptr->prev;
    pmVar3 = __ptr->next;
    pmVar3->prev = pmVar2;
    pmVar2->next = pmVar3;
    __ptr->next = __ptr;
    __ptr->prev = __ptr;
    iVar1 = *(int *)&__ptr[1].prev;
    *size = iVar1;
    if (data != (void *)0x0) {
      memcpy(data,(void *)((long)&__ptr[1].prev + 4),(long)iVar1);
    }
    free(__ptr);
    this->count = this->count + -1;
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

RK_S32 mpp_list::fifo_rd(void *data, RK_S32 *size)
{
    RK_S32 ret = -EINVAL;
    if (head && count) {
        mpp_list_node *node = head->next;

        mpp_list_del_init(node);
        release_list_with_size(node, data, size);
        count--;
        ret = 0;
    }
    return ret;
}